

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall units::find_unit_abi_cxx11_(string *__return_storage_ptr__,units *this,unit un)

{
  char *pcVar1;
  bool bVar2;
  pointer ppVar3;
  pointer pvVar4;
  allocator local_39;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> local_38;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> local_30;
  const_iterator fnd;
  _Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_20;
  iterator fndud;
  unit un_local;
  
  fndud.
  super__Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               )this;
  bVar2 = std::atomic<bool>::load((atomic<bool> *)&allowUserDefinedUnits,memory_order_acquire);
  if ((bVar2) &&
     (bVar2 = std::
              unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)user_defined_unit_names_abi_cxx11_), !bVar2)) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)user_defined_unit_names_abi_cxx11_,(key_type *)&fndud);
    fnd.super__Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true>)
         std::
         unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)user_defined_unit_names_abi_cxx11_);
    bVar2 = std::__detail::operator!=
                      (&local_20,
                       (_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        *)&fnd);
    if (bVar2) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)&local_20);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
      return __return_storage_ptr__;
    }
  }
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
       ::find((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
               *)base_unit_names,(key_type *)&fndud);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
       ::end((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
              *)base_unit_names);
  bVar2 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar2) {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>
                         *)&local_30);
    pcVar1 = pvVar4->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string find_unit(unit un)
{  // cppcheck suppression active
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_unit_names.empty()) {
            auto fndud = user_defined_unit_names.find(un);
            if (fndud != user_defined_unit_names.end()) {
                return fndud->second;
            }
        }
    }
    auto fnd = base_unit_names.find(un);
    if (fnd != base_unit_names.end()) {
        return fnd->second;
    }
    return std::string{};
}